

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::RangeSelectExpression::isConstantSelect
          (RangeSelectExpression *this,EvalContext *context)

{
  bool bVar1;
  bool bVar2;
  Expression *pEVar3;
  Type *this_00;
  bool local_8a;
  ConstantValue local_88;
  byte local_49;
  ConstantValue local_48;
  EvalContext *local_20;
  EvalContext *context_local;
  RangeSelectExpression *this_local;
  
  local_20 = context;
  context_local = (EvalContext *)this;
  pEVar3 = value(this);
  this_00 = not_null<const_slang::ast::Type_*>::operator->(&pEVar3->type);
  bVar2 = Type::hasFixedRange(this_00);
  local_49 = 0;
  bVar1 = false;
  local_8a = false;
  if (bVar2) {
    pEVar3 = left(this);
    Expression::eval(&local_48,pEVar3,local_20);
    local_49 = 1;
    bVar2 = slang::ConstantValue::operator_cast_to_bool(&local_48);
    local_8a = false;
    if (bVar2) {
      pEVar3 = right(this);
      Expression::eval(&local_88,pEVar3,local_20);
      bVar1 = true;
      local_8a = slang::ConstantValue::operator_cast_to_bool(&local_88);
    }
  }
  this_local._7_1_ = local_8a;
  if (bVar1) {
    slang::ConstantValue::~ConstantValue(&local_88);
  }
  if ((local_49 & 1) != 0) {
    slang::ConstantValue::~ConstantValue(&local_48);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RangeSelectExpression::isConstantSelect(EvalContext& context) const {
    return value().type->hasFixedRange() && left().eval(context) && right().eval(context);
}